

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dist.c
# Opt level: O1

long dist2(Point *p,Point *q)

{
  long lVar1;
  long lVar2;
  long lVar3;
  
  lVar1 = p->x - q->x;
  lVar3 = -lVar1;
  if (0 < lVar1) {
    lVar3 = lVar1;
  }
  lVar2 = p->y - q->y;
  lVar1 = -lVar2;
  if (0 < lVar2) {
    lVar1 = lVar2;
  }
  return lVar1 + lVar3;
}

Assistant:

long  dist2(
  Point*  p,
  Point*  q
)
{
  long  dx, dy;
    
  dx = (p->x) - (q->x);
  if( dx < 0 )  dx = -dx;
  dy = (p->y) - (q->y);
  if( dy < 0 )  dy = -dy;

  return  dx + dy; 
}